

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

ResendRequest *
anon_unknown.dwarf_52c65e::createResendRequest
          (ResendRequest *__return_storage_ptr__,char *sender,char *target,int seq,int begin,int end
          )

{
  undefined1 *this;
  int iVar1;
  ResendRequest *extraout_RAX;
  FieldBase local_78;
  
  FIX42::ResendRequest::ResendRequest(__return_storage_ptr__);
  FIX::UInt64Field::UInt64Field((UInt64Field *)&local_78,7,(ulong)target & 0xffffffff);
  local_78._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00327528;
  FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,&local_78,true);
  FIX::FieldBase::~FieldBase(&local_78);
  FIX::UInt64Field::UInt64Field((UInt64Field *)&local_78,0x10,(ulong)(uint)seq);
  local_78._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00327560;
  FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,&local_78,true);
  FIX::FieldBase::~FieldBase(&local_78);
  this = &(__return_storage_ptr__->super_Message).field_0x70;
  fillHeader((Header *)this,"ISLD","TW",(int)sender);
  iVar1 = FIX::Message::bodyLength((Message *)__return_storage_ptr__,8,9,10);
  FIX::IntField::IntField((IntField *)&local_78,9,iVar1);
  local_78._vptr_FieldBase = (_func_int **)&PTR__FieldBase_003253c8;
  FIX::FieldMap::setField((FieldMap *)this,&local_78,true);
  FIX::FieldBase::~FieldBase(&local_78);
  iVar1 = FIX::Message::checkSum((Message *)__return_storage_ptr__,10);
  FIX::CheckSumField::CheckSumField((CheckSumField *)&local_78,10,iVar1);
  local_78._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00325560;
  FIX::FieldMap::setField
            ((FieldMap *)&(__return_storage_ptr__->super_Message).field_0xe0,&local_78,true);
  FIX::FieldBase::~FieldBase(&local_78);
  return extraout_RAX;
}

Assistant:

FIX42::ResendRequest createResendRequest(const char *sender, const char *target, int seq, int begin, int end) {
  FIX42::ResendRequest resendRequest;
  resendRequest.set(BeginSeqNo(begin));
  resendRequest.set(EndSeqNo(end));
  fillHeader(resendRequest.getHeader(), sender, target, seq);
  resendRequest.getHeader().setField(BodyLength(resendRequest.bodyLength()));
  resendRequest.getTrailer().setField(CheckSum(resendRequest.checkSum()));
  return resendRequest;
}